

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusinputcontextproxy.h
# Opt level: O2

QDBusPendingReply<> * __thiscall
QIBusInputContextProxy::SetCursorLocationRelative
          (QDBusPendingReply<> *__return_storage_ptr__,QIBusInputContextProxy *this,int x,int y,
          int w,int h)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QVariant> local_e8;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  enable_if_t<std::is_copy_constructible_v<int>_&&_std::is_destructible_v<int>,_QVariant> local_b8;
  enable_if_t<std::is_copy_constructible_v<int>_&&_std::is_destructible_v<int>,_QVariant> local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (QVariant *)0x0;
  local_e8.size = 0;
  local_c8 = h;
  local_c4 = w;
  local_c0 = y;
  local_bc = x;
  QVariant::fromValue<int>
            ((enable_if_t<std::is_copy_constructible_v<int>_&&_std::is_destructible_v<int>,_QVariant>
              *)local_58,&local_bc);
  QList<QVariant>::emplaceBack<QVariant>
            ((QList<QVariant> *)&local_e8,
             (enable_if_t<std::is_copy_constructible_v<int>_&&_std::is_destructible_v<int>,_QVariant>
              *)local_58);
  QVariant::fromValue<int>
            ((enable_if_t<std::is_copy_constructible_v<int>_&&_std::is_destructible_v<int>,_QVariant>
              *)&local_78,&local_c0);
  QList<QVariant>::emplaceBack<QVariant>((QList<QVariant> *)&local_e8,(QVariant *)&local_78);
  QVariant::fromValue<int>(&local_98,&local_c4);
  QList<QVariant>::emplaceBack<QVariant>((QList<QVariant> *)&local_e8,&local_98);
  QVariant::fromValue<int>(&local_b8,&local_c8);
  QList<QVariant>::emplaceBack<QVariant>((QList<QVariant> *)&local_e8,&local_b8);
  QVariant::~QVariant(&local_b8);
  QVariant::~QVariant(&local_98);
  QVariant::~QVariant((QVariant *)&local_78);
  QVariant::~QVariant((enable_if_t<std::is_copy_constructible_v<int>_&&_std::is_destructible_v<int>,_QVariant>
                       *)local_58);
  local_58._0_8_ = (PrivateShared *)0x0;
  local_78.shared = (PrivateShared *)0x0;
  local_78._8_8_ = 0;
  local_58._8_8_ = L"SetCursorLocationRelative";
  local_78._16_8_ = 0;
  local_58._16_8_ = 0x19;
  QDBusAbstractInterface::asyncCallWithArgumentList((QString *)&local_98,(QList *)this);
  QDBusPendingReply<>::QDBusPendingReply(__return_storage_ptr__,(QDBusPendingCall *)&local_98);
  QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusPendingReply<> SetCursorLocationRelative(int x, int y, int w, int h)
    {
        QList<QVariant> argumentList;
        argumentList << QVariant::fromValue(x) << QVariant::fromValue(y) << QVariant::fromValue(w) << QVariant::fromValue(h);
        return asyncCallWithArgumentList(QStringLiteral("SetCursorLocationRelative"), argumentList);
    }